

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_hash_request(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  element_type *this_01;
  error_code_enum e;
  bool bVar1;
  int iVar2;
  file_index_t fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ulong uVar8;
  span<const_char> sVar9;
  span<libtorrent::digest32<256L>_> hashes_00;
  hash_request hr;
  shared_ptr<libtorrent::aux::torrent> t;
  sha256_hash file_root;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  char *local_38;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x1f) & 1) == 0) {
    e = invalid_message;
  }
  else {
    this_00 = &this->m_recv_buffer;
    iVar2 = crypto_receive_buffer::packet_size(this_00);
    if (iVar2 == 0x31) {
      bVar1 = crypto_receive_buffer::packet_finished(this_00);
      if (!bVar1) {
        return;
      }
      ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&file_root,
                 &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
      ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&file_root);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(file_root.m_number._M_elems + 2));
      this_01 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar9 = crypto_receive_buffer::get(this_00);
      pcVar7 = sVar9.m_ptr;
      file_root.m_number._M_elems._0_8_ = *(undefined8 *)(pcVar7 + 1);
      file_root.m_number._M_elems._8_8_ = *(undefined8 *)(pcVar7 + 9);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar7 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar7 + 0x19);
      fVar3 = file_storage::file_index_for_root(&this_01->m_files,&file_root);
      local_38 = pcVar7 + 0x21;
      uVar4 = read_impl<int,char_const*>(&local_38);
      uVar5 = read_impl<int,char_const*>(&local_38);
      uVar6 = read_impl<int,char_const*>(&local_38);
      hr.proof_layers = read_impl<int,char_const*>(&local_38);
      uVar8 = (ulong)(uint)hr.proof_layers;
      hr.file = fVar3;
      hr.base = uVar4;
      hr.index = uVar5;
      hr.count = uVar6;
      bVar1 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
      if (bVar1) {
        peer_connection::peer_log
                  (&this->super_peer_connection,incoming_message,"HASH_REQUEST",
                   "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)fVar3.m_val,
                   (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,uVar8);
      }
      bVar1 = validate_hash_request(&hr,&this_01->m_files);
      if (bVar1) {
        torrent::get_hashes(&hashes,t.
                                    super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,&hr);
        if (hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          write_hash_reject(this,&hr,&file_root);
        }
        else {
          hashes_00.m_len =
               (long)hashes.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)hashes.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
          hashes_00.m_ptr =
               hashes.
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          write_hashes(this,&hr,hashes_00);
        }
        ::std::
        _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
        ~_Vector_base(&hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     );
      }
      else {
        write_hash_reject(this,&hr,&file_root);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    e = invalid_hash_request;
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            ((error_code *)&file_root,e,(type *)0x0);
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,(error_code *)&file_root,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_hash_request(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_recv_buffer.packet_size() != 1 + 32 + 4 + 4 + 4 + 4)
		{
			disconnect(errors::invalid_hash_request, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();
		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t const file_index = files.file_index_for_root(file_root);
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);
		hash_request hr(file_index, base, index, count, proof_layers);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!validate_hash_request(hr, files))
		{
			write_hash_reject(hr, file_root);
			return;
		}

		std::vector<sha256_hash> hashes = t->get_hashes(hr);

		if (hashes.empty())
		{
			write_hash_reject(hr, file_root);
			return;
		}

		write_hashes(hr, hashes);
	}